

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

void __thiscall Win32MakefileGenerator::processRcFileVar(Win32MakefileGenerator *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  FILE *__stream;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  qsizetype qVar10;
  QTextStream *pQVar11;
  QString *pQVar12;
  ulong uVar13;
  char *pcVar14;
  long in_RDI;
  long in_FS_OFFSET;
  bool ok;
  bool writeRcFile;
  int i_1;
  int rcCodePage;
  int rcLang;
  ProString *icon;
  ProStringList *__range2;
  int i;
  char16_t *str;
  char16_t *str_1;
  QString resDestDir;
  QFileInfo fi;
  QString resFile;
  QFile rcFile;
  QString rcFilename;
  QString manifestResourceId;
  QString trademarks;
  QString comments;
  QString internalName;
  QString originalName;
  QString productName;
  QString copyright;
  QString description;
  QString companyName;
  const_iterator __end2;
  const_iterator __begin2;
  ProStringList icons;
  QStringList rcIcons;
  QString versionString;
  QStringList vers;
  QTextStream ts;
  QByteArray rcString;
  QString manifestFile;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>,_const_char_(&)[4]>
  *in_stack_ffffffffffffe658;
  ProString *this_00;
  QMakeProject *in_stack_ffffffffffffe660;
  QMakeProject *this_01;
  QMakeProject *in_stack_ffffffffffffe668;
  QLatin1String *in_stack_ffffffffffffe670;
  undefined2 uVar15;
  QMakeEvaluator *in_stack_ffffffffffffe678;
  QMakeProject *in_stack_ffffffffffffe680;
  QList<QString> *in_stack_ffffffffffffe688;
  MakefileGenerator *in_stack_ffffffffffffe690;
  char *in_stack_ffffffffffffe698;
  undefined8 in_stack_ffffffffffffe6a8;
  qsizetype in_stack_ffffffffffffe6c8;
  undefined8 in_stack_ffffffffffffe700;
  undefined7 in_stack_ffffffffffffe708;
  undefined1 in_stack_ffffffffffffe70f;
  MakefileGenerator *in_stack_ffffffffffffe710;
  byte local_16e1;
  byte local_169e;
  bool local_169d;
  int local_169c;
  int local_167c;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_ffffffffffffebbc;
  undefined8 local_1320;
  undefined8 local_1318;
  undefined8 local_1310;
  QFileInfo local_12f0 [128];
  QString *local_1270;
  CaseSensitivity local_1268;
  undefined8 local_11e8 [16];
  undefined8 local_1168;
  undefined8 local_1160;
  undefined8 local_1158;
  QFileInfo local_1010 [8];
  undefined1 local_1008 [24];
  undefined1 local_ff0 [24];
  QDir local_fd8 [48];
  undefined1 local_fa8 [24];
  undefined8 local_f90;
  undefined8 local_f88;
  undefined8 local_d38;
  undefined8 local_d30;
  undefined8 local_d28;
  QChar local_d1a [13];
  undefined1 local_d00 [29];
  QLatin1Char local_ce3 [27];
  undefined1 local_cc8 [25];
  QLatin1Char local_caf [4];
  QLatin1Char local_cab [51];
  undefined1 local_c78 [48];
  undefined1 local_c48 [24];
  undefined1 local_c30 [24];
  undefined1 local_c18 [24];
  undefined1 local_c00 [24];
  undefined1 local_be8 [24];
  undefined1 local_bd0 [24];
  QArrayDataPointer<char16_t> local_bb8 [2];
  QArrayDataPointer<char16_t> local_b88 [6];
  undefined8 local_af8;
  undefined8 local_af0;
  undefined8 local_ae8;
  QChar local_ada [16];
  QChar local_aba [25];
  undefined1 local_a88 [126];
  QChar local_a0a [61];
  undefined8 local_990;
  undefined8 local_988;
  undefined8 local_980;
  QChar local_972 [61];
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined8 local_8e8;
  QChar local_8da [61];
  undefined8 local_860;
  undefined8 local_858;
  undefined8 local_850;
  QChar local_70a [61];
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  QChar local_5fa [61];
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  QChar local_562 [61];
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  QChar local_4ca [61];
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  QChar local_432 [61];
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  ProString *local_368;
  const_iterator local_360;
  const_iterator local_358 [7];
  QList<ProString> local_320;
  QList<QString> local_308;
  QChar local_2ea;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined1 local_2b0 [120];
  undefined1 local_238 [24];
  QList<QString> local_220;
  uint local_204;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  _Optional_payload_base<QFlags<QFileDevice::Permission>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (Option::qmake_mode == QMAKE_GENERATE_NOTHING) goto LAB_002b46c2;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
  QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
  ProString::toQString((ProString *)in_stack_ffffffffffffe658);
  ProString::~ProString((ProString *)0x2b153c);
  ProKey::~ProKey((ProKey *)0x2b1549);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
  QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
  bVar7 = QList<ProString>::isEmpty((QList<ProString> *)0x2b1591);
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  bVar8 = false;
  if (bVar7) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    bVar6 = true;
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar7 = QList<ProString>::isEmpty((QList<ProString> *)0x2b161f);
    if ((!bVar7) || (bVar7 = QString::isEmpty((QString *)0x2b1632), !bVar7)) goto LAB_002b163a;
LAB_002b17fe:
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    bVar8 = true;
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar7 = QList<ProString>::isEmpty((QList<ProString> *)0x2b184e);
    local_16e1 = bVar7 ^ 0xff;
  }
  else {
LAB_002b163a:
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    bVar5 = true;
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar7 = QList<ProString>::isEmpty((QList<ProString> *)0x2b168a);
    if (!bVar7) goto LAB_002b17fe;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    bVar4 = true;
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar7 = QList<ProString>::isEmpty((QList<ProString> *)0x2b16e3);
    if (!bVar7) goto LAB_002b17fe;
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    bVar3 = true;
    bVar7 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffffe668,(QString *)in_stack_ffffffffffffe660,
                       SUB81((ulong)in_stack_ffffffffffffe658 >> 0x38,0));
    if (bVar7) goto LAB_002b17fe;
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    bVar2 = true;
    bVar7 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffffe668,(QString *)in_stack_ffffffffffffe660,
                       SUB81((ulong)in_stack_ffffffffffffe658 >> 0x38,0));
    local_16e1 = 1;
    if (!bVar7) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      bVar1 = true;
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      bVar7 = QList<ProString>::isEmpty((QList<ProString> *)0x2b17ec);
      local_16e1 = 1;
      if (bVar7) goto LAB_002b17fe;
    }
  }
  if (bVar8) {
    ProKey::~ProKey((ProKey *)0x2b187e);
  }
  if (bVar1) {
    ProKey::~ProKey((ProKey *)0x2b1897);
  }
  if (bVar2) {
    QString::~QString((QString *)0x2b18b0);
  }
  if (bVar3) {
    QString::~QString((QString *)0x2b18c9);
  }
  if (bVar4) {
    ProKey::~ProKey((ProKey *)0x2b18e2);
  }
  if (bVar5) {
    ProKey::~ProKey((ProKey *)0x2b18fb);
  }
  if (bVar6) {
    ProKey::~ProKey((ProKey *)0x2b1914);
  }
  ProKey::~ProKey((ProKey *)0x2b1921);
  if ((local_16e1 & 1) != 0) {
    local_1f0 = 0xaaaaaaaaaaaaaaaa;
    local_1e8 = 0xaaaaaaaaaaaaaaaa;
    local_1e0 = 0xaaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x2b196b);
    local_200 = 0xaaaaaaaaaaaaaaaa;
    local_1f8 = 0xaaaaaaaaaaaaaaaa;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffe660,
               (OpenModeFlag)((ulong)in_stack_ffffffffffffe658 >> 0x20));
    QTextStream::QTextStream
              ((QTextStream *)&local_200,(QByteArray *)&local_1f0,
               (QFlags_conflict *)(ulong)local_204);
    local_220.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_220.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    local_220.d.size = -0x5555555555555556;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
    ProString::toQString((ProString *)in_stack_ffffffffffffe658);
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    QFlags<Qt::SplitBehaviorFlags>::QFlags
              ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_ffffffffffffe660,
               (SplitBehaviorFlags)((ulong)in_stack_ffffffffffffe658 >> 0x20));
    QString::split((QString *)&local_220,(QFlags_conflict *)local_238,(CaseSensitivity)local_2b0);
    QString::~QString((QString *)0x2b1a9e);
    QString::~QString((QString *)0x2b1aab);
    ProString::~ProString((ProString *)0x2b1ab8);
    ProKey::~ProKey((ProKey *)0x2b1ac5);
    qVar10 = QList<QString>::size(&local_220);
    for (local_167c = (int)qVar10; local_167c < 4; local_167c = local_167c + 1) {
      QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
      QList<QString>::operator+=
                ((QList<QString> *)in_stack_ffffffffffffe660,(rvalue_ref)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b1b19);
    }
    local_2e8 = 0xaaaaaaaaaaaaaaaa;
    local_2e0 = 0xaaaaaaaaaaaaaaaa;
    local_2d8 = 0xaaaaaaaaaaaaaaaa;
    QChar::QChar<char,_true>(&local_2ea,'.');
    QListSpecialMethods<QString>::join
              ((QListSpecialMethods<QString> *)in_stack_ffffffffffffe668,
               (QChar)(char16_t)((ulong)in_stack_ffffffffffffe678 >> 0x30));
    local_308.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_308.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    local_308.d.size = -0x5555555555555556;
    QList<QString>::QList((QList<QString> *)0x2b1bc2);
    local_320.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_320.d.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_320.d.size = -0x5555555555555556;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    ProStringList::ProStringList
              ((ProStringList *)in_stack_ffffffffffffe660,(ProStringList *)in_stack_ffffffffffffe658
              );
    ProKey::~ProKey((ProKey *)0x2b1c4c);
    QList<ProString>::size(&local_320);
    QList<QString>::reserve(in_stack_ffffffffffffe688,in_stack_ffffffffffffe6c8);
    local_358[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_358[0] = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffe660);
    local_360.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_360 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffe660);
    while( true ) {
      local_368 = local_360.i;
      bVar8 = QList<ProString>::const_iterator::operator!=(local_358,local_360);
      if (!bVar8) break;
      QList<ProString>::const_iterator::operator*(local_358);
      ProString::toQString((ProString *)in_stack_ffffffffffffe658);
      QFlags<MakefileGenerator::FileFixifyType>::QFlags
                ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe660,
                 (FileFixifyType)((ulong)in_stack_ffffffffffffe658 >> 0x20));
      MakefileGenerator::fileFixify
                (in_stack_ffffffffffffe710,
                 (QString *)CONCAT17(in_stack_ffffffffffffe70f,in_stack_ffffffffffffe708),
                 (FileFixifyTypes)in_stack_ffffffffffffebbc.i,
                 SUB81((ulong)in_stack_ffffffffffffe700 >> 0x38,0));
      QList<QString>::append
                ((QList<QString> *)in_stack_ffffffffffffe660,(rvalue_ref)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b1d9b);
      QString::~QString((QString *)0x2b1da8);
      QList<ProString>::const_iterator::operator++(local_358);
    }
    local_3b8 = 0xaaaaaaaaaaaaaaaa;
    local_3b0 = 0xaaaaaaaaaaaaaaaa;
    local_3a8 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2b1df4);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b1e3c);
    ProKey::~ProKey((ProKey *)0x2b1e52);
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QChar::QChar<char,_true>(local_432,' ');
      ProStringList::join((ProStringList *)in_stack_ffffffffffffe658,
                          (QChar)(char16_t)((ulong)in_stack_ffffffffffffe668 >> 0x30));
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b1efb);
      ProKey::~ProKey((ProKey *)0x2b1f08);
    }
    local_450 = 0xaaaaaaaaaaaaaaaa;
    local_448 = 0xaaaaaaaaaaaaaaaa;
    local_440 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2b1f42);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b1f8a);
    ProKey::~ProKey((ProKey *)0x2b1fa0);
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QChar::QChar<char,_true>(local_4ca,' ');
      ProStringList::join((ProStringList *)in_stack_ffffffffffffe658,
                          (QChar)(char16_t)((ulong)in_stack_ffffffffffffe668 >> 0x30));
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b2049);
      ProKey::~ProKey((ProKey *)0x2b2056);
    }
    local_4e8 = 0xaaaaaaaaaaaaaaaa;
    local_4e0 = 0xaaaaaaaaaaaaaaaa;
    local_4d8 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2b2090);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b20d8);
    ProKey::~ProKey((ProKey *)0x2b20ee);
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QChar::QChar<char,_true>(local_562,' ');
      ProStringList::join((ProStringList *)in_stack_ffffffffffffe658,
                          (QChar)(char16_t)((ulong)in_stack_ffffffffffffe668 >> 0x30));
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b2197);
      ProKey::~ProKey((ProKey *)0x2b21a4);
    }
    local_580 = 0xaaaaaaaaaaaaaaaa;
    local_578 = 0xaaaaaaaaaaaaaaaa;
    local_570 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2b21de);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b2226);
    ProKey::~ProKey((ProKey *)0x2b223c);
    if (((bVar8 ^ 0xffU) & 1) == 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
      ProString::toQString((ProString *)in_stack_ffffffffffffe658);
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b2376);
      ProString::~ProString((ProString *)0x2b2383);
      ProKey::~ProKey((ProKey *)0x2b2390);
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QChar::QChar<char,_true>(local_5fa,' ');
      ProStringList::join((ProStringList *)in_stack_ffffffffffffe658,
                          (QChar)(char16_t)((ulong)in_stack_ffffffffffffe668 >> 0x30));
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b22e5);
      ProKey::~ProKey((ProKey *)0x2b22f2);
    }
    local_690 = 0xaaaaaaaaaaaaaaaa;
    local_688 = 0xaaaaaaaaaaaaaaaa;
    local_680 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2b23ca);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b2412);
    ProKey::~ProKey((ProKey *)0x2b2428);
    if (((bVar8 ^ 0xffU) & 1) == 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
      ::operator+((ProString *)in_stack_ffffffffffffe668,(ProString *)in_stack_ffffffffffffe660);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffffe658);
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b25c7);
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffffe660);
      ProString::~ProString((ProString *)0x2b25e1);
      ProKey::~ProKey((ProKey *)0x2b25ee);
      ProString::~ProString((ProString *)0x2b25fb);
      ProKey::~ProKey((ProKey *)0x2b2608);
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QChar::QChar<char,_true>(local_70a,' ');
      ProStringList::join((ProStringList *)in_stack_ffffffffffffe658,
                          (QChar)(char16_t)((ulong)in_stack_ffffffffffffe668 >> 0x30));
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b24d1);
      ProKey::~ProKey((ProKey *)0x2b24de);
    }
    local_860 = 0xaaaaaaaaaaaaaaaa;
    local_858 = 0xaaaaaaaaaaaaaaaa;
    local_850 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2b2642);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b268a);
    ProKey::~ProKey((ProKey *)0x2b26a0);
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QChar::QChar<char,_true>(local_8da,' ');
      ProStringList::join((ProStringList *)in_stack_ffffffffffffe658,
                          (QChar)(char16_t)((ulong)in_stack_ffffffffffffe668 >> 0x30));
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b2749);
      ProKey::~ProKey((ProKey *)0x2b2756);
    }
    local_8f8 = 0xaaaaaaaaaaaaaaaa;
    local_8f0 = 0xaaaaaaaaaaaaaaaa;
    local_8e8 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2b2790);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b27d8);
    ProKey::~ProKey((ProKey *)0x2b27ee);
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QChar::QChar<char,_true>(local_972,' ');
      ProStringList::join((ProStringList *)in_stack_ffffffffffffe658,
                          (QChar)(char16_t)((ulong)in_stack_ffffffffffffe668 >> 0x30));
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b2897);
      ProKey::~ProKey((ProKey *)0x2b28a4);
    }
    local_990 = 0xaaaaaaaaaaaaaaaa;
    local_988 = 0xaaaaaaaaaaaaaaaa;
    local_980 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2b28de);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b2926);
    ProKey::~ProKey((ProKey *)0x2b293c);
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QChar::QChar<char,_true>(local_a0a,' ');
      ProStringList::join((ProStringList *)in_stack_ffffffffffffe658,
                          (QChar)(char16_t)((ulong)in_stack_ffffffffffffe668 >> 0x30));
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b29e5);
      ProKey::~ProKey((ProKey *)0x2b29f2);
    }
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::intValue
              (in_stack_ffffffffffffe680,(ProKey *)in_stack_ffffffffffffe678,
               (int)((ulong)in_stack_ffffffffffffe670 >> 0x20));
    ProKey::~ProKey((ProKey *)0x2b2a4b);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::intValue
              (in_stack_ffffffffffffe680,(ProKey *)in_stack_ffffffffffffe678,
               (int)((ulong)in_stack_ffffffffffffe670 >> 0x20));
    ProKey::~ProKey((ProKey *)0x2b2ab2);
    QTextStream::operator<<((QTextStream *)&local_200,"#include <windows.h>\n");
    ::operator<<((QTextStream *)in_stack_ffffffffffffe660,
                 (QTextStreamFunction)in_stack_ffffffffffffe658);
    bVar8 = QList<QString>::isEmpty((QList<QString> *)0x2b2af5);
    if (!bVar8) {
      local_169c = 0;
      while( true ) {
        qVar10 = QList<QString>::size(&local_308);
        if (qVar10 <= local_169c) break;
        QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
        QChar::QChar<char16_t,_true>(local_aba,L' ');
        QString::arg<int,_true>
                  ((QString *)in_stack_ffffffffffffe668,
                   (int)((ulong)in_stack_ffffffffffffe660 >> 0x20),(int)in_stack_ffffffffffffe660,
                   (int)((ulong)in_stack_ffffffffffffe658 >> 0x20),
                   (QChar)(char16_t)((ulong)in_stack_ffffffffffffe678 >> 0x30));
        QList<QString>::operator[]
                  ((QList<QString> *)in_stack_ffffffffffffe660,(qsizetype)in_stack_ffffffffffffe658)
        ;
        cQuoted((QString *)in_stack_ffffffffffffe668);
        QChar::QChar<char16_t,_true>(local_ada,L' ');
        QString::arg<QString,_true>
                  ((QString *)in_stack_ffffffffffffe680,(QString *)in_stack_ffffffffffffe678,
                   (int)((ulong)in_stack_ffffffffffffe670 >> 0x20),
                   (QChar)(char16_t)((ulong)in_stack_ffffffffffffe6a8 >> 0x30));
        QTextStream::operator<<((QTextStream *)&local_200,(QString *)local_a88);
        ::operator<<((QTextStream *)in_stack_ffffffffffffe660,
                     (QTextStreamFunction)in_stack_ffffffffffffe658);
        QString::~QString((QString *)0x2b2c2d);
        QString::~QString((QString *)0x2b2c3a);
        QString::~QString((QString *)0x2b2c47);
        QString::~QString((QString *)0x2b2c54);
        local_169c = local_169c + 1;
      }
      ::operator<<((QTextStream *)in_stack_ffffffffffffe660,
                   (QTextStreamFunction)in_stack_ffffffffffffe658);
    }
    bVar8 = QString::isEmpty((QString *)0x2b2c8b);
    if (!bVar8) {
      local_af8 = 0xaaaaaaaaaaaaaaaa;
      local_af0 = 0xaaaaaaaaaaaaaaaa;
      local_ae8 = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x2b2ccd);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
      bVar8 = ProString::operator==
                        ((ProString *)in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678);
      ProString::~ProString((ProString *)0x2b2d3d);
      ProKey::~ProKey((ProKey *)0x2b2d4a);
      if (bVar8) {
        QArrayDataPointer<char16_t>::QArrayDataPointer
                  (local_b88,(Data *)0x0,L"ISOLATIONAWARE_MANIFEST_RESOURCE_ID",0x23);
        QString::QString((QString *)in_stack_ffffffffffffe660,
                         (DataPointer *)in_stack_ffffffffffffe658);
        QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658
                          );
        QString::~QString((QString *)0x2b2dde);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffe660);
      }
      else {
        QArrayDataPointer<char16_t>::QArrayDataPointer
                  (local_bb8,(Data *)0x0,L"CREATEPROCESS_MANIFEST_RESOURCE_ID",0x22);
        QString::QString((QString *)in_stack_ffffffffffffe660,
                         (DataPointer *)in_stack_ffffffffffffe658);
        QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658
                          );
        QString::~QString((QString *)0x2b2e74);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffe660);
      }
      pQVar11 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_200,(QString *)&local_af8);
      pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11," RT_MANIFEST \"");
      pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_28);
      QTextStream::operator<<(pQVar11,"\"\n");
      QString::~QString((QString *)0x2b2ed1);
    }
    QTextStream::operator<<((QTextStream *)&local_200,"VS_VERSION_INFO VERSIONINFO\n");
    pQVar11 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_200,"\tFILEVERSION ");
    QString::QString((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    pQVar12 = (QString *)
              QString::replace((QString *)local_bd0,(QString *)local_be8,(CaseSensitivity)local_c00)
    ;
    QTextStream::operator<<(pQVar11,pQVar12);
    ::operator<<((QTextStream *)in_stack_ffffffffffffe660,
                 (QTextStreamFunction)in_stack_ffffffffffffe658);
    QString::~QString((QString *)0x2b2f8c);
    QString::~QString((QString *)0x2b2f99);
    QString::~QString((QString *)0x2b2fa6);
    pQVar11 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_200,"\tPRODUCTVERSION ");
    QString::QString((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    pQVar12 = (QString *)
              QString::replace((QString *)local_c18,(QString *)local_c30,(CaseSensitivity)local_c48)
    ;
    QTextStream::operator<<(pQVar11,pQVar12);
    ::operator<<((QTextStream *)in_stack_ffffffffffffe660,
                 (QTextStreamFunction)in_stack_ffffffffffffe658);
    QString::~QString((QString *)0x2b304d);
    QString::~QString((QString *)0x2b305a);
    QString::~QString((QString *)0x2b3067);
    QTextStream::operator<<((QTextStream *)&local_200,"\tFILEFLAGSMASK 0x3fL\n");
    QTextStream::operator<<((QTextStream *)&local_200,"#ifdef _DEBUG\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\tFILEFLAGS VS_FF_DEBUG\n");
    QTextStream::operator<<((QTextStream *)&local_200,"#else\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\tFILEFLAGS 0x0L\n");
    QTextStream::operator<<((QTextStream *)&local_200,"#endif\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\tFILEOS VOS_NT_WINDOWS32\n");
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    bVar8 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffffe668,(QString *)in_stack_ffffffffffffe660,
                       SUB81((ulong)in_stack_ffffffffffffe658 >> 0x38,0));
    QString::~QString((QString *)0x2b3149);
    if (bVar8) {
      QTextStream::operator<<((QTextStream *)&local_200,"\tFILETYPE VFT_DLL\n");
    }
    else {
      QTextStream::operator<<((QTextStream *)&local_200,"\tFILETYPE VFT_APP\n");
    }
    QTextStream::operator<<((QTextStream *)&local_200,"\tFILESUBTYPE VFT2_UNKNOWN\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\tBEGIN\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\t\tBLOCK \"StringFileInfo\"\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\t\tBEGIN\n");
    pQVar11 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_200,"\t\t\tBLOCK \"");
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    QLatin1Char::QLatin1Char(local_cab,'0');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_ffffffffffffe660,
               (QLatin1Char)(char)((ulong)in_stack_ffffffffffffe668 >> 0x38));
    QString::arg<int,_true>
              ((QString *)in_stack_ffffffffffffe668,(int)((ulong)in_stack_ffffffffffffe660 >> 0x20),
               (int)in_stack_ffffffffffffe660,(int)((ulong)in_stack_ffffffffffffe658 >> 0x20),
               (QChar)(char16_t)((ulong)in_stack_ffffffffffffe678 >> 0x30));
    QLatin1Char::QLatin1Char(local_caf,'0');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_ffffffffffffe660,
               (QLatin1Char)(char)((ulong)in_stack_ffffffffffffe668 >> 0x38));
    QString::arg<int,_true>
              ((QString *)in_stack_ffffffffffffe668,(int)((ulong)in_stack_ffffffffffffe660 >> 0x20),
               (int)in_stack_ffffffffffffe660,(int)((ulong)in_stack_ffffffffffffe658 >> 0x20),
               (QChar)(char16_t)((ulong)in_stack_ffffffffffffe678 >> 0x30));
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)local_c78);
    QTextStream::operator<<(pQVar11,"\"\n");
    QString::~QString((QString *)0x2b32fb);
    QString::~QString((QString *)0x2b3308);
    QString::~QString((QString *)0x2b3315);
    QTextStream::operator<<((QTextStream *)&local_200,"\t\t\tBEGIN\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_200,"\t\t\t\tVALUE \"CompanyName\", \"")
    ;
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_3b8);
    QTextStream::operator<<(pQVar11,"\\0\"\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_200,"\t\t\t\tVALUE \"FileDescription\", \"");
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_450);
    QTextStream::operator<<(pQVar11,"\\0\"\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_200,"\t\t\t\tVALUE \"FileVersion\", \"")
    ;
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_2e8);
    QTextStream::operator<<(pQVar11,"\\0\"\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_200,"\t\t\t\tVALUE \"LegalCopyright\", \"");
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_4e8);
    QTextStream::operator<<(pQVar11,"\\0\"\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_200,"\t\t\t\tVALUE \"OriginalFilename\", \"");
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_690);
    QTextStream::operator<<(pQVar11,"\\0\"\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_200,"\t\t\t\tVALUE \"ProductName\", \"")
    ;
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_580);
    QTextStream::operator<<(pQVar11,"\\0\"\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_200,"\t\t\t\tVALUE \"ProductVersion\", \"");
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_2e8);
    QTextStream::operator<<(pQVar11,"\\0\"\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_200,"\t\t\t\tVALUE \"InternalName\", \"");
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_860);
    QTextStream::operator<<(pQVar11,"\\0\"\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_200,"\t\t\t\tVALUE \"Comments\", \"");
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_8f8);
    QTextStream::operator<<(pQVar11,"\\0\"\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_200,"\t\t\t\tVALUE \"LegalTrademarks\", \"");
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_990);
    QTextStream::operator<<(pQVar11,"\\0\"\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\t\t\tEND\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\t\tEND\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\t\tBLOCK \"VarFileInfo\"\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\t\tBEGIN\n");
    pQVar11 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_200,"\t\t\tVALUE \"Translation\", ");
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    QLatin1Char::QLatin1Char(local_ce3,'0');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_ffffffffffffe660,
               (QLatin1Char)(char)((ulong)in_stack_ffffffffffffe668 >> 0x38));
    QString::arg<int,_true>
              ((QString *)in_stack_ffffffffffffe668,(int)((ulong)in_stack_ffffffffffffe660 >> 0x20),
               (int)in_stack_ffffffffffffe660,(int)((ulong)in_stack_ffffffffffffe658 >> 0x20),
               (QChar)(char16_t)((ulong)in_stack_ffffffffffffe678 >> 0x30));
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)local_cc8);
    pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,", ");
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    QChar::QChar<char16_t,_true>(local_d1a,L' ');
    QString::arg<int,_true>
              ((QString *)in_stack_ffffffffffffe668,(int)((ulong)in_stack_ffffffffffffe660 >> 0x20),
               (int)in_stack_ffffffffffffe660,(int)((ulong)in_stack_ffffffffffffe658 >> 0x20),
               (QChar)(char16_t)((ulong)in_stack_ffffffffffffe678 >> 0x30));
    QTextStream::operator<<(pQVar11,(QString *)local_d00);
    ::operator<<((QTextStream *)in_stack_ffffffffffffe660,
                 (QTextStreamFunction)in_stack_ffffffffffffe658);
    QString::~QString((QString *)0x2b36cd);
    QString::~QString((QString *)0x2b36da);
    QString::~QString((QString *)0x2b36e7);
    QString::~QString((QString *)0x2b36f4);
    QTextStream::operator<<((QTextStream *)&local_200,"\t\tEND\n");
    QTextStream::operator<<((QTextStream *)&local_200,"\tEND\n");
    QTextStream::operator<<((QTextStream *)&local_200,"/* End of Version info */\n");
    ::operator<<((QTextStream *)in_stack_ffffffffffffe660,
                 (QTextStreamFunction)in_stack_ffffffffffffe658);
    QTextStream::flush();
    local_d38 = 0xaaaaaaaaaaaaaaaa;
    local_d30 = 0xaaaaaaaaaaaaaaaa;
    local_d28 = 0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
    ::operator+((ProString *)in_stack_ffffffffffffe668,(char (*) [2])in_stack_ffffffffffffe660);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
    ::operator+((QStringBuilder<ProString,_const_char_(&)[2]> *)in_stack_ffffffffffffe668,
                (ProString *)in_stack_ffffffffffffe660);
    ::operator+((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
                in_stack_ffffffffffffe668,(char (*) [10])in_stack_ffffffffffffe660);
    ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>
                 *)in_stack_ffffffffffffe668,(char (*) [4])in_stack_ffffffffffffe660);
    ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffe658);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>,_const_char_(&)[4]>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>,_const_char_(&)[4]>
                       *)0x2b38a1);
    QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>
                       *)0x2b38ae);
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
               in_stack_ffffffffffffe660);
    ProString::~ProString((ProString *)0x2b38c8);
    ProKey::~ProKey((ProKey *)0x2b38d5);
    QStringBuilder<ProString,_const_char_(&)[2]>::~QStringBuilder
              ((QStringBuilder<ProString,_const_char_(&)[2]> *)0x2b38e2);
    ProString::~ProString((ProString *)0x2b38ef);
    ProKey::~ProKey((ProKey *)0x2b38fc);
    local_f90 = 0xaaaaaaaaaaaaaaaa;
    local_f88 = 0xaaaaaaaaaaaaaaaa;
    QDir::cleanPath((QString *)local_fa8);
    QFile::QFile((QFile *)&local_f90,(QString *)local_fa8);
    QString::~QString((QString *)0x2b3951);
    local_169d = true;
    uVar13 = QFile::exists();
    if ((uVar13 & 1) != 0) {
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffe660,
                 (OpenModeFlag)((ulong)in_stack_ffffffffffffe658 >> 0x20));
      uVar13 = QFile::open((QFlags_conflict *)&local_f90);
      if ((uVar13 & 1) != 0) {
        QIODevice::readAll();
        local_169d = ::operator!=((QByteArray *)in_stack_ffffffffffffe678,
                                  (QByteArray *)in_stack_ffffffffffffe670);
        QByteArray::~QByteArray((QByteArray *)0x2b39d8);
        QFileDevice::close();
      }
    }
    if (local_169d != false) {
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffe660,
                 (OpenModeFlag)((ulong)in_stack_ffffffffffffe658 >> 0x20));
      local_169e = QFile::open((QFlags_conflict *)&local_f90);
      local_169e = local_169e & 1;
      if (local_169e == 0) {
        QString::QString((QString *)0x2b3a45);
        QDir::QDir(local_fd8,(QString *)local_ff0);
        QFileInfo::QFileInfo(local_1010,(QFileDevice *)&local_f90);
        QFileInfo::path();
        std::optional<QFlags<QFileDevice::Permission>_>::optional
                  ((optional<QFlags<QFileDevice::Permission>_> *)&local_10);
        QDir::mkpath(local_fd8,local_1008,local_10);
        QString::~QString((QString *)0x2b3abb);
        QFileInfo::~QFileInfo(local_1010);
        QDir::~QDir(local_fd8);
        QString::~QString((QString *)0x2b3ae2);
        QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffe660,
                   (OpenModeFlag)((ulong)in_stack_ffffffffffffe658 >> 0x20));
        local_169e = QFile::open((QFlags_conflict *)&local_f90);
        local_169e = local_169e & 1;
      }
      __stream = _stderr;
      if (local_169e == 0) {
        QFile::fileName();
        QString::toLatin1((QString *)in_stack_ffffffffffffe658);
        pcVar14 = QByteArray::constData((QByteArray *)0x2b3b68);
        fprintf(__stream,"Cannot open for writing: %s",pcVar14);
        QByteArray::~QByteArray((QByteArray *)0x2b3b8e);
        QString::~QString((QString *)0x2b3b9b);
        exit(1);
      }
      QIODevice::write((QByteArray *)&local_f90);
      QFileDevice::close();
    }
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b3c0f);
    ProKey::~ProKey((ProKey *)0x2b3c23);
    if (bVar8) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QFile::fileName();
      ProString::ProString
                ((ProString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QList<ProString>::insert
                ((QList<ProString> *)in_stack_ffffffffffffe668,(qsizetype)in_stack_ffffffffffffe660,
                 (rvalue_ref)in_stack_ffffffffffffe658);
      ProString::~ProString((ProString *)0x2b3cd3);
      QString::~QString((QString *)0x2b3ce0);
      ProKey::~ProKey((ProKey *)0x2b3ced);
    }
    QFile::~QFile((QFile *)&local_f90);
    QString::~QString((QString *)0x2b3d07);
    QString::~QString((QString *)0x2b3d14);
    QString::~QString((QString *)0x2b3d21);
    QString::~QString((QString *)0x2b3d2e);
    QString::~QString((QString *)0x2b3d3b);
    QString::~QString((QString *)0x2b3d48);
    QString::~QString((QString *)0x2b3d55);
    QString::~QString((QString *)0x2b3d62);
    QString::~QString((QString *)0x2b3d6f);
    ProStringList::~ProStringList((ProStringList *)0x2b3d7c);
    QList<QString>::~QList((QList<QString> *)0x2b3d89);
    QString::~QString((QString *)0x2b3d96);
    QList<QString>::~QList((QList<QString> *)0x2b3da3);
    QTextStream::~QTextStream((QTextStream *)&local_200);
    QByteArray::~QByteArray((QByteArray *)0x2b3dbd);
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
  QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
  bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b3e05);
  bVar9 = bVar8 ^ 0xff;
  ProKey::~ProKey((ProKey *)0x2b3e1b);
  if ((bVar9 & 1) != 0) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    bVar8 = QList<ProString>::isEmpty((QList<ProString> *)0x2b3e73);
    ProKey::~ProKey((ProKey *)0x2b3e89);
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Both rc and res file specified.\n");
      fprintf(_stderr,"Please specify one of them, not both.");
      exit(1);
    }
    local_1168 = 0xaaaaaaaaaaaaaaaa;
    local_1160 = 0xaaaaaaaaaaaaaaaa;
    local_1158 = 0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
    ProString::toQString((ProString *)in_stack_ffffffffffffe658);
    ProString::~ProString((ProString *)0x2b3f67);
    ProKey::~ProKey((ProKey *)0x2b3f74);
    qmake_getpwd();
    bVar8 = ::operator!=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
    QString::~QString((QString *)0x2b3fa9);
    if (bVar8) {
      local_11e8[0] = 0xaaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo((QFileInfo *)local_11e8,(QString *)&local_1168);
      QFileInfo::absoluteFilePath();
      ProString::ProString
                ((ProString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QList<ProString>::first((QList<ProString> *)in_stack_ffffffffffffe660);
      ProString::operator=
                ((ProString *)in_stack_ffffffffffffe660,(ProString *)in_stack_ffffffffffffe658);
      ProKey::~ProKey((ProKey *)0x2b406c);
      ProString::~ProString((ProString *)0x2b4079);
      QString::~QString((QString *)0x2b4086);
      QFileInfo::~QFileInfo((QFileInfo *)local_11e8);
    }
    QLatin1String::QLatin1String(in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
    QString::replace((QLatin1String *)&local_1168,local_1270,local_1268);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
    QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
    QString::QString((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
    MakefileGenerator::fileInfo(in_stack_ffffffffffffe690,(QString *)in_stack_ffffffffffffe688);
    QFileInfo::fileName();
    ProString::ProString
              ((ProString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
    QList<ProString>::prepend
              ((QList<ProString> *)in_stack_ffffffffffffe660,(rvalue_ref)in_stack_ffffffffffffe658);
    ProString::~ProString((ProString *)0x2b418b);
    QString::~QString((QString *)0x2b4198);
    QFileInfo::~QFileInfo(local_12f0);
    QString::~QString((QString *)0x2b41b2);
    ProKey::~ProKey((ProKey *)0x2b41bf);
    local_1320 = 0xaaaaaaaaaaaaaaaa;
    local_1318 = 0xaaaaaaaaaaaaaaaa;
    local_1310 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2b41f9);
    QString::QString((QString *)in_stack_ffffffffffffe668,in_stack_ffffffffffffe698);
    bVar8 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffffe668,(QString *)in_stack_ffffffffffffe660,
                       SUB81((ulong)in_stack_ffffffffffffe658 >> 0x38,0));
    QString::~QString((QString *)0x2b4246);
    if (bVar8) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
      ProString::toQString((ProString *)in_stack_ffffffffffffe658);
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b42cc);
      ProString::~ProString((ProString *)0x2b42d9);
      ProKey::~ProKey((ProKey *)0x2b42e6);
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
      ProString::toQString((ProString *)in_stack_ffffffffffffe658);
      QString::operator=((QString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      QString::~QString((QString *)0x2b4364);
      ProString::~ProString((ProString *)0x2b4371);
      ProKey::~ProKey((ProKey *)0x2b437e);
    }
    bVar8 = QString::isEmpty((QString *)0x2b438b);
    if (!bVar8) {
      QString::append((QString *)&local_1320);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)in_stack_ffffffffffffe658);
      QMakeProject::values(in_stack_ffffffffffffe660,(ProKey *)in_stack_ffffffffffffe658);
      QList<ProString>::first((QList<ProString> *)in_stack_ffffffffffffe660);
      ProString::ProString
                ((ProString *)in_stack_ffffffffffffe660,(QString *)in_stack_ffffffffffffe658);
      ProString::prepend((ProString *)in_stack_ffffffffffffe680,
                         (ProString *)in_stack_ffffffffffffe678);
      ProString::~ProString((ProString *)0x2b4422);
      ProKey::~ProKey((ProKey *)0x2b442f);
    }
    this_00 = *(ProString **)(in_RDI + 0xd8);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe660,(char *)this_00);
    QMakeEvaluator::first(in_stack_ffffffffffffe678,(ProKey *)in_stack_ffffffffffffe670);
    uVar15 = (undefined2)((ulong)in_stack_ffffffffffffe670 >> 0x30);
    ProString::toQString(this_00);
    Option::fixPathToTargetOS
              ((QString *)in_stack_ffffffffffffe678,SUB21((ushort)uVar15 >> 8,0),SUB21(uVar15,0));
    ProString::ProString((ProString *)in_stack_ffffffffffffe660,&this_00->m_string);
    this_01 = *(QMakeProject **)(in_RDI + 0xd8);
    ProKey::ProKey((ProKey *)this_01,(char *)this_00);
    QMakeProject::values(this_01,(ProKey *)this_00);
    QList<ProString>::first((QList<ProString> *)this_01);
    ProString::operator=((ProString *)this_01,this_00);
    ProKey::~ProKey((ProKey *)0x2b4514);
    ProString::~ProString((ProString *)0x2b4521);
    QString::~QString((QString *)0x2b452e);
    QString::~QString((QString *)0x2b453b);
    ProString::~ProString((ProString *)0x2b4548);
    ProKey::~ProKey((ProKey *)0x2b4555);
    ProKey::ProKey((ProKey *)this_01,(char *)this_00);
    QMakeProject::values(this_01,(ProKey *)this_00);
    ProKey::ProKey((ProKey *)this_01,(char *)this_00);
    QMakeProject::values(this_01,(ProKey *)this_00);
    QList<ProString>::operator+=((QList<ProString> *)this_01,(QList<ProString> *)this_00);
    ProKey::~ProKey((ProKey *)0x2b45eb);
    ProKey::~ProKey((ProKey *)0x2b45f8);
    ProKey::ProKey((ProKey *)this_01,(char *)this_00);
    QMakeProject::values(this_01,(ProKey *)this_00);
    ProKey::ProKey((ProKey *)this_01,(char *)this_00);
    QMakeProject::values(this_01,(ProKey *)this_00);
    QList<ProString>::operator+=((QList<ProString> *)this_01,(QList<ProString> *)this_00);
    ProKey::~ProKey((ProKey *)0x2b468e);
    ProKey::~ProKey((ProKey *)0x2b469b);
    QString::~QString((QString *)0x2b46a8);
    QString::~QString((QString *)0x2b46b5);
  }
  QString::~QString((QString *)0x2b46c2);
LAB_002b46c2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Win32MakefileGenerator::processRcFileVar()
{
    if (Option::qmake_mode == Option::QMAKE_GENERATE_NOTHING)
        return;

    const QString manifestFile = project->first("QMAKE_MANIFEST").toQString();
    if (((!project->values("VERSION").isEmpty() || !project->values("RC_ICONS").isEmpty() || !manifestFile.isEmpty())
        && project->values("RC_FILE").isEmpty()
        && project->values("RES_FILE").isEmpty()
        && !project->isActiveConfig("no_generated_target_info")
        && (project->isActiveConfig("shared") || !project->values("QMAKE_APP_FLAG").isEmpty()))
        || !project->values("QMAKE_WRITE_DEFAULT_RC").isEmpty()){

        QByteArray rcString;
        QTextStream ts(&rcString, QFile::WriteOnly);

        QStringList vers = project->first("VERSION").toQString().split(".", Qt::SkipEmptyParts);
        for (int i = vers.size(); i < 4; i++)
            vers += "0";
        QString versionString = vers.join('.');

        QStringList rcIcons;
        const auto icons = project->values("RC_ICONS");
        rcIcons.reserve(icons.size());
        for (const ProString &icon : icons)
            rcIcons.append(fileFixify(icon.toQString(), FileFixifyAbsolute));

        QString companyName;
        if (!project->values("QMAKE_TARGET_COMPANY").isEmpty())
            companyName = project->values("QMAKE_TARGET_COMPANY").join(' ');

        QString description;
        if (!project->values("QMAKE_TARGET_DESCRIPTION").isEmpty())
            description = project->values("QMAKE_TARGET_DESCRIPTION").join(' ');

        QString copyright;
        if (!project->values("QMAKE_TARGET_COPYRIGHT").isEmpty())
            copyright = project->values("QMAKE_TARGET_COPYRIGHT").join(' ');

        QString productName;
        if (!project->values("QMAKE_TARGET_PRODUCT").isEmpty())
            productName = project->values("QMAKE_TARGET_PRODUCT").join(' ');
        else
            productName = project->first("TARGET").toQString();

        QString originalName;
        if (!project->values("QMAKE_TARGET_ORIGINAL_FILENAME").isEmpty())
            originalName = project->values("QMAKE_TARGET_ORIGINAL_FILENAME").join(' ');
        else
            originalName = project->first("TARGET") + project->first("TARGET_EXT");

        QString internalName;
        if (!project->values("QMAKE_TARGET_INTERNALNAME").isEmpty())
            internalName = project->values("QMAKE_TARGET_INTERNALNAME").join(' ');

        QString comments;
        if (!project->values("QMAKE_TARGET_COMMENTS").isEmpty())
            comments = project->values("QMAKE_TARGET_COMMENTS").join(' ');

        QString trademarks;
        if (!project->values("QMAKE_TARGET_TRADEMARKS").isEmpty())
            trademarks = project->values("QMAKE_TARGET_TRADEMARKS").join(' ');

        int rcLang = project->intValue("RC_LANG", 1033);            // default: English(USA)
        int rcCodePage = project->intValue("RC_CODEPAGE", 1200);    // default: Unicode

        ts << "#include <windows.h>\n";
        ts << Qt::endl;
        if (!rcIcons.isEmpty()) {
            for (int i = 0; i < rcIcons.size(); ++i)
                ts << QString("IDI_ICON%1\tICON\t%2").arg(i + 1).arg(cQuoted(rcIcons[i])) << Qt::endl;
            ts << Qt::endl;
        }
        if (!manifestFile.isEmpty()) {
            QString manifestResourceId;
            if (project->first("TEMPLATE") == "lib")
                manifestResourceId = QStringLiteral("ISOLATIONAWARE_MANIFEST_RESOURCE_ID");
            else
                manifestResourceId = QStringLiteral("CREATEPROCESS_MANIFEST_RESOURCE_ID");
            ts << manifestResourceId << " RT_MANIFEST \"" << manifestFile << "\"\n";
        }
        ts << "VS_VERSION_INFO VERSIONINFO\n";
        ts << "\tFILEVERSION " << QString(versionString).replace(".", ",") << Qt::endl;
        ts << "\tPRODUCTVERSION " << QString(versionString).replace(".", ",") << Qt::endl;
        ts << "\tFILEFLAGSMASK 0x3fL\n";
        ts << "#ifdef _DEBUG\n";
        ts << "\tFILEFLAGS VS_FF_DEBUG\n";
        ts << "#else\n";
        ts << "\tFILEFLAGS 0x0L\n";
        ts << "#endif\n";
        ts << "\tFILEOS VOS_NT_WINDOWS32\n";
        if (project->isActiveConfig("shared"))
            ts << "\tFILETYPE VFT_DLL\n";
        else
            ts << "\tFILETYPE VFT_APP\n";
        ts << "\tFILESUBTYPE VFT2_UNKNOWN\n";
        ts << "\tBEGIN\n";
        ts << "\t\tBLOCK \"StringFileInfo\"\n";
        ts << "\t\tBEGIN\n";
        ts << "\t\t\tBLOCK \""
           << QString("%1%2").arg(rcLang, 4, 16, QLatin1Char('0')).arg(rcCodePage, 4, 16, QLatin1Char('0'))
           << "\"\n";
        ts << "\t\t\tBEGIN\n";
        ts << "\t\t\t\tVALUE \"CompanyName\", \"" << companyName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"FileDescription\", \"" <<  description << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"FileVersion\", \"" << versionString << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"LegalCopyright\", \"" << copyright << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"OriginalFilename\", \"" << originalName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"ProductName\", \"" << productName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"ProductVersion\", \"" << versionString << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"InternalName\", \"" << internalName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"Comments\", \"" << comments << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"LegalTrademarks\", \"" << trademarks << "\\0\"\n";
        ts << "\t\t\tEND\n";
        ts << "\t\tEND\n";
        ts << "\t\tBLOCK \"VarFileInfo\"\n";
        ts << "\t\tBEGIN\n";
        ts << "\t\t\tVALUE \"Translation\", "
           << QString("0x%1").arg(rcLang, 4, 16, QLatin1Char('0'))
           << ", " << QString("%1").arg(rcCodePage, 4) << Qt::endl;
        ts << "\t\tEND\n";
        ts << "\tEND\n";
        ts << "/* End of Version info */\n";
        ts << Qt::endl;

        ts.flush();


        QString rcFilename = project->first("OUT_PWD")
                           + "/"
                           + project->first("TARGET")
                           + "_resource"
                           + ".rc";
        QFile rcFile(QDir::cleanPath(rcFilename));

        bool writeRcFile = true;
        if (rcFile.exists() && rcFile.open(QFile::ReadOnly)) {
            writeRcFile = rcFile.readAll() != rcString;
            rcFile.close();
        }
        if (writeRcFile) {
            bool ok;
            ok = rcFile.open(QFile::WriteOnly);
            if (!ok) {
                // The file can't be opened... try creating the containing
                // directory first (needed for clean shadow builds)
                QDir().mkpath(QFileInfo(rcFile).path());
                ok = rcFile.open(QFile::WriteOnly);
            }
            if (!ok) {
                ::fprintf(stderr, "Cannot open for writing: %s", rcFile.fileName().toLatin1().constData());
                ::exit(1);
            }
            rcFile.write(rcString);
            rcFile.close();
        }
        if (project->values("QMAKE_WRITE_DEFAULT_RC").isEmpty())
            project->values("RC_FILE").insert(0, rcFile.fileName());
    }
    if (!project->values("RC_FILE").isEmpty()) {
        if (!project->values("RES_FILE").isEmpty()) {
            fprintf(stderr, "Both rc and res file specified.\n");
            fprintf(stderr, "Please specify one of them, not both.");
            exit(1);
        }
        QString resFile = project->first("RC_FILE").toQString();

        // if this is a shadow build then use the absolute path of the rc file
        if (Option::output_dir != qmake_getpwd()) {
            QFileInfo fi(resFile);
            project->values("RC_FILE").first() = fi.absoluteFilePath();
        }

        resFile.replace(QLatin1String(".rc"), Option::res_ext);
        project->values("RES_FILE").prepend(fileInfo(resFile).fileName());
        QString resDestDir;
        if (project->isActiveConfig("staticlib"))
            resDestDir = project->first("DESTDIR").toQString();
        else
            resDestDir = project->first("OBJECTS_DIR").toQString();
        if (!resDestDir.isEmpty()) {
            resDestDir.append(Option::dir_sep);
            project->values("RES_FILE").first().prepend(resDestDir);
        }
        project->values("RES_FILE").first() = Option::fixPathToTargetOS(
                    project->first("RES_FILE").toQString(), false);
        project->values("POST_TARGETDEPS") += project->values("RES_FILE");
        project->values("CLEAN_FILES") += project->values("RES_FILE");
    }
}